

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O0

void a__appProcessXMotion(XEvent *e)

{
  ATimeUs AVar1;
  int iVar2;
  int iVar3;
  int dy;
  int dx;
  ATimeUs timestamp;
  XEvent *e_local;
  
  AVar1 = aAppTime();
  iVar2 = (e->xkey).x - a__app_state.pointer.x;
  iVar3 = (e->xkey).y - a__app_state.pointer.y;
  a__app_state.pointer.x = (e->xkey).x;
  a__app_state.pointer.y = (e->xkey).y;
  if (a__app_state.grabbed != 0) {
    if (((e->xkey).x == (int)a__app_state.width / 2) &&
       ((e->xkey).y == (int)a__app_state.height / 2)) {
      return;
    }
    XWarpPointer(a__x11.display,0,a__x11.window,0,0,0,0,a__app_state.width >> 1,
                 a__app_state.height >> 1);
  }
  if (a__app_proctable.pointer != (_func_void_ATimeUs_int_int_uint *)0x0) {
    (*a__app_proctable.pointer)(AVar1,iVar2,iVar3,0);
  }
  return;
}

Assistant:

static void a__appProcessXMotion(const XEvent *e) {
	ATimeUs timestamp = aAppTime();
	int dx = e->xmotion.x - a__app_state.pointer.x, dy = e->xmotion.y - a__app_state.pointer.y;

	a__app_state.pointer.x = e->xmotion.x;
	a__app_state.pointer.y = e->xmotion.y;

	if (a__app_state.grabbed) {
		if (e->xmotion.x == (int)a__app_state.width / 2 && e->xmotion.y == (int)a__app_state.height / 2)
			return;

		XWarpPointer(a__x11.display, None, a__x11.window, 0, 0, 0, 0, a__app_state.width / 2, a__app_state.height / 2);
	}

	if (a__app_proctable.pointer)
		a__app_proctable.pointer(timestamp, dx, dy, 0);
}